

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printbuf.c
# Opt level: O3

printbuf * printbuf_new(void)

{
  printbuf *__ptr;
  char *pcVar1;
  
  __ptr = (printbuf *)calloc(1,0x10);
  if (__ptr != (printbuf *)0x0) {
    __ptr->size = 0x20;
    pcVar1 = (char *)malloc(0x20);
    __ptr->buf = pcVar1;
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
      return __ptr;
    }
    free(__ptr);
  }
  return (printbuf *)0x0;
}

Assistant:

struct printbuf *printbuf_new(void)
{
	struct printbuf *p;

	p = (struct printbuf *)calloc(1, sizeof(struct printbuf));
	if (!p)
		return NULL;
	p->size = 32;
	p->bpos = 0;
	if (!(p->buf = (char *)malloc(p->size)))
	{
		free(p);
		return NULL;
	}
	p->buf[0] = '\0';
	return p;
}